

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Descriptor *this_00;
  string_view value;
  Arg local_78;
  string_view local_48 [2];
  int local_28;
  undefined1 local_21;
  int depth;
  DebugStringOptions *debug_string_options_local;
  FieldDescriptor *this_local;
  string *contents;
  
  local_21 = 0;
  _depth = debug_string_options;
  debug_string_options_local = (DebugStringOptions *)this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 0;
  bVar1 = is_extension(this);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_48,"extend .$0 {\n");
    this_00 = containing_type(this);
    value = Descriptor::full_name(this_00);
    absl::lts_20250127::substitute_internal::Arg::Arg(&local_78,value);
    absl::lts_20250127::SubstituteAndAppend(__return_storage_ptr__,local_48[0],&local_78);
    local_28 = 1;
  }
  DebugString(this,local_28,__return_storage_ptr__,_depth);
  bVar1 = is_extension(this);
  if (bVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  int depth = 0;
  if (is_extension()) {
    absl::SubstituteAndAppend(&contents, "extend .$0 {\n",
                              containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}